

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O0

void __thiscall QProgressDialog::reset(QProgressDialog *this)

{
  bool bVar1;
  QProgressDialogPrivate *this_00;
  undefined8 in_RDI;
  char *unaff_retaddr;
  QProgressDialogPrivate *d;
  ConnectionType c;
  
  c = (ConnectionType)((ulong)in_RDI >> 0x20);
  this_00 = d_func((QProgressDialog *)0x7b1a8b);
  if (((this_00->autoClose & 1U) != 0) || ((this_00->forceHide & 1U) != 0)) {
    QWidget::hide((QWidget *)0x7b1ab5);
  }
  QProgressBar::reset((QProgressBar *)this_00);
  this_00->cancellationFlag = false;
  this_00->shownOnce = false;
  this_00->setValueCalled = false;
  QTimer::stop();
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QObject> *)0x7b1b0c);
  if (bVar1) {
    QMetaObject::invokeMethod<>((QObject *)d,unaff_retaddr,c);
  }
  return;
}

Assistant:

void QProgressDialog::reset()
{
    Q_D(QProgressDialog);
    if (d->autoClose || d->forceHide)
        hide();
    d->bar->reset();
    d->cancellationFlag = false;
    d->shownOnce = false;
    d->setValueCalled = false;
    d->forceTimer->stop();

    /*
        I wish we could disconnect the user slot provided to open() here but
        unfortunately reset() is usually called before the slot has been invoked.
        (reset() is itself invoked when canceled() is emitted.)
    */
    if (d->receiverToDisconnectOnClose)
        QMetaObject::invokeMethod(this, "_q_disconnectOnClose", Qt::QueuedConnection);
}